

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void wasm::EffectAnalyzer::InternalAnalyzer::doStartCatch(InternalAnalyzer *self,Expression **currp)

{
  EffectAnalyzer *pEVar1;
  Try *pTVar2;
  size_type sVar3;
  
  pTVar2 = Expression::cast<wasm::Try>(*currp);
  if (*(long *)(pTVar2 + 0x18) != 0) {
    sVar3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                      (&self->parent->delegateTargets,(key_type *)(pTVar2 + 0x10));
    pEVar1 = self->parent;
    if ((sVar3 != 0) && (pEVar1->tryDepth == 0)) {
      pEVar1->throws_ = true;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::erase(&(pEVar1->delegateTargets)._M_t,(key_type *)(pTVar2 + 0x10));
  }
  pEVar1 = self->parent;
  if (*(long *)(pTVar2 + 0x50) - *(long *)(pTVar2 + 0x30) == 1) {
    if (pEVar1->tryDepth == 0) {
      __assert_fail("self->parent.tryDepth > 0 && \"try depth cannot be negative\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/effects.h"
                    ,0x193,
                    "static void wasm::EffectAnalyzer::InternalAnalyzer::doStartCatch(InternalAnalyzer *, Expression **)"
                   );
    }
    pEVar1->tryDepth = pEVar1->tryDepth - 1;
  }
  pEVar1->catchDepth = pEVar1->catchDepth + 1;
  return;
}

Assistant:

static void doStartCatch(InternalAnalyzer* self, Expression** currp) {
      Try* curr = (*currp)->cast<Try>();
      // This is conservative. When an inner try-delegate targets the current
      // expression, even if the try-delegate's body can't throw, we consider
      // the current expression can throw for simplicity, unless the current
      // expression is not inside a try-catch_all. It is hard to figure out
      // whether the original try-delegate's body throws or not at this point.
      if (curr->name.is()) {
        if (self->parent.delegateTargets.count(curr->name) &&
            self->parent.tryDepth == 0) {
          self->parent.throws_ = true;
        }
        self->parent.delegateTargets.erase(curr->name);
      }
      // We only count 'try's with a 'catch_all' because instructions within a
      // 'try' without a 'catch_all' can still throw outside of the try.
      if (curr->hasCatchAll()) {
        assert(self->parent.tryDepth > 0 && "try depth cannot be negative");
        self->parent.tryDepth--;
      }
      self->parent.catchDepth++;
    }